

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManPrintGetMuxFanins(Gia_Man_t *p,Gia_Obj_t *pObj,int *pFanins)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  int *pFanins_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  pData0 = (Gia_Obj_t *)pFanins;
  pFanins_local = (int *)pObj;
  pObj_local = (Gia_Obj_t *)p;
  pGVar4 = Gia_ObjRecognizeMux(pObj,&pCtrl,&pData1);
  pGVar1 = pObj_local;
  pGVar4 = Gia_Regular(pGVar4);
  iVar2 = Gia_ObjId((Gia_Man_t *)pGVar1,pGVar4);
  pGVar1 = pObj_local;
  *(int *)pData0 = iVar2;
  pGVar4 = Gia_Regular(pCtrl);
  iVar2 = Gia_ObjId((Gia_Man_t *)pGVar1,pGVar4);
  pGVar1 = pObj_local;
  *(int *)&pData0->field_0x4 = iVar2;
  pGVar4 = Gia_Regular(pData1);
  uVar3 = Gia_ObjId((Gia_Man_t *)pGVar1,pGVar4);
  pData0->Value = uVar3;
  return;
}

Assistant:

void Gia_ManPrintGetMuxFanins( Gia_Man_t * p, Gia_Obj_t * pObj, int * pFanins )
{
    Gia_Obj_t * pData0, * pData1;
    Gia_Obj_t * pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
    pFanins[0] = Gia_ObjId(p, Gia_Regular(pCtrl));
    pFanins[1] = Gia_ObjId(p, Gia_Regular(pData1));
    pFanins[2] = Gia_ObjId(p, Gia_Regular(pData0));
}